

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::Core>
helics::CoreFactory::create(CoreType type,string_view coreName,string_view configureString)

{
  string_view message;
  string_view message_00;
  string_view name;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  basic_string_view<char,_std::char_traits<char>_> *this;
  element_type *peVar4;
  undefined8 uVar5;
  undefined4 extraout_var;
  char *in_RCX;
  size_t in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  __shared_ptr *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  __sv_type _Var6;
  shared_ptr<helics::Core> sVar7;
  undefined1 in_stack_00000070 [16];
  string_view in_stack_00000080;
  CoreType newType;
  string newName;
  shared_ptr<helics::Core> *core;
  string *in_stack_00000618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  allocator<char> *in_stack_fffffffffffffe28;
  __shared_ptr *this_01;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe48;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  undefined8 uVar9;
  char *in_stack_fffffffffffffe58;
  size_t local_140;
  char *local_138;
  allocator<char> local_109 [77];
  int local_bc;
  int local_94;
  undefined8 local_90;
  undefined8 uStack_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_01 = in_RDI;
  local_94 = in_ESI;
  local_90 = in_R8;
  uStack_88 = in_R9;
  local_80._M_len = in_RDX;
  local_80._M_str = in_RCX;
  std::__cxx11::string::string(in_stack_fffffffffffffe20);
  if ((local_94 == 0x65) ||
     (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_80), bVar1))
  {
    in_stack_fffffffffffffe28 = local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    helics::core::extractCoreType(in_stack_00000618);
    std::tie<helics::CoreType,std::__cxx11::string>
              ((CoreType *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe10);
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffe20,
               (pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x4e7d64);
    std::__cxx11::string::~string(in_stack_fffffffffffffe10);
    std::allocator<char>::~allocator(local_109);
    bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_80);
    if ((bVar1) &&
       (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x4e7da1), !bVar1)) {
      _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe10);
      local_140 = _Var6._M_len;
      local_80._M_len = local_140;
      local_138 = _Var6._M_str;
      local_80._M_str = local_138;
    }
    if (local_94 == 0x65) {
      local_94 = local_bc;
    }
  }
  name._M_str = in_stack_fffffffffffffe58;
  name._M_len = (size_t)in_stack_fffffffffffffe50;
  makeCore((CoreType)((ulong)in_stack_fffffffffffffe48 >> 0x20),name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(this_01);
  if (!bVar1) {
    this = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this,(char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    message._M_str = (char *)this_01;
    message._M_len = (size_t)in_stack_fffffffffffffe28;
    RegistrationFailure::RegistrationFailure((RegistrationFailure *)this,message);
    __cxa_throw(this,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x4e7f2e);
  (*peVar4->_vptr_Core[2])(peVar4,local_90,uStack_88);
  uVar2 = registerCore((shared_ptr<helics::Core> *)CONCAT44(uStack_88._4_4_,(undefined4)uStack_88),
                       local_90._4_4_);
  if (!(bool)uVar2) {
    uVar5 = __cxa_allocate_exception(0x28);
    pcVar8 = "core {} failed to register properly";
    uVar9 = 0x23;
    peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4e7fb3);
    iVar3 = (*peVar4->_vptr_Core[0xc])();
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(extraout_var,iVar3);
    local_18 = &stack0xfffffffffffffe58;
    local_48 = pcVar8;
    uStack_40 = uVar9;
    local_30 = this_00;
    local_28 = pcVar8;
    uStack_20 = uVar9;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffe20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffe18));
    local_8 = &local_58;
    local_10 = local_68;
    local_58 = 0xd;
    local_50 = local_10;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_00000080,(format_args)in_stack_00000070);
    std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
    message_00._M_str = (char *)this_01;
    message_00._M_len = (size_t)in_stack_fffffffffffffe28;
    RegistrationFailure::RegistrationFailure
              ((RegistrationFailure *)in_stack_fffffffffffffe20,message_00);
    __cxa_throw(uVar5,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffe10);
  sVar7.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI
  ;
  return (shared_ptr<helics::Core>)
         sVar7.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core>
    create(CoreType type, std::string_view coreName, std::string_view configureString)
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || coreName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(std::string{configureString});
        if (coreName.empty() && !newName.empty()) {
            coreName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto core = makeCore(type, coreName);
    if (!core) {
        throw(helics::RegistrationFailure("unable to create core"));
    }
    core->configure(configureString);
    if (!registerCore(core, type)) {
        throw(helics::RegistrationFailure(
            fmt::format("core {} failed to register properly", core->getIdentifier())));
    }

    return core;
}